

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::q_relocate_overlap_n_left_move<std::reverse_iterator<Header*>,long_long>
               (reverse_iterator<Header_*> first,longlong n,reverse_iterator<Header_*> d_first)

{
  long lVar1;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  Header *pHVar5;
  Header *pHVar6;
  Header *pHVar7;
  Header *pHVar8;
  long in_FS_OFFSET;
  Destructor local_58;
  anon_class_8_1_a78179b7_conflict local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.end.current =
       *(Header **)
        &((d_first.current)->name).data.
         super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
         super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
         super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
         super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
         super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>;
  local_58.intermediate.current = (Header *)0x0;
  pHVar7 = local_58.end.current + -n;
  pHVar8 = *(Header **)
            &((first.current)->name).data.
             super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
             super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
             super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
             super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
             super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>;
  pHVar6 = pHVar8;
  pHVar5 = pHVar7;
  if (pHVar7 < pHVar8) {
    pHVar6 = pHVar7;
    pHVar5 = pHVar8;
  }
  pHVar8 = *(Header **)
            &((d_first.current)->name).data.
             super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
             super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
             super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
             super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
             super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>;
  local_58.iter = (reverse_iterator<Header_*> *)d_first.current;
  while (pHVar8 != pHVar5) {
    local_40.__lhs =
         (_Move_ctor_base<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)(pHVar8 + -1);
    lVar1 = *(long *)&((first.current)->name).data.
                      super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                      super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                      super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                      super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                      super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>;
    *(__index_type *)
     ((long)&pHVar8[-1].name.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
             super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
             super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
             super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18) = 0xff;
    *(__index_type *)
     ((long)&pHVar8[-1].name.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
             super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
             super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
             super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18) =
         *(__index_type *)(lVar1 + -0x20);
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&&>
      ::_S_vtable._M_arr[(long)*(char *)(lVar1 + -0x20) + 1]._M_data)
              (&local_40,(variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)(lVar1 + -0x38));
    pDVar2 = *(Data **)(lVar1 + -0x18);
    *(undefined8 *)(lVar1 + -0x18) = 0;
    pHVar8[-1].value.d.d = pDVar2;
    pcVar3 = *(char **)(lVar1 + -0x10);
    *(undefined8 *)(lVar1 + -0x10) = 0;
    pHVar8[-1].value.d.ptr = pcVar3;
    qVar4 = *(qsizetype *)(lVar1 + -8);
    *(undefined8 *)(lVar1 + -8) = 0;
    pHVar8[-1].value.d.size = qVar4;
    *(long *)&((d_first.current)->name).data.
              super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
              super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
              super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
              super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
              super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> =
         *(long *)&((d_first.current)->name).data.
                   super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + -0x38;
    *(long *)&((first.current)->name).data.
              super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
              super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
              super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
              super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
              super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> =
         *(long *)&((first.current)->name).data.
                   super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                   super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + -0x38;
    pHVar8 = *(Header **)
              &((d_first.current)->name).data.
               super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>;
  }
  local_58.intermediate.current =
       *(Header **)
        &(((Header *)local_58.iter)->name).data.
         super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
         super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
         super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
         super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
         super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>;
  local_58.iter = &local_58.intermediate;
  pHVar8 = *(Header **)
            &((d_first.current)->name).data.
             super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
             super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
             super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
             super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
             super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>;
  if (pHVar8 != pHVar7) {
    do {
      lVar1 = *(long *)&((first.current)->name).data.
                        super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                        super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                        super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                        super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                        super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>;
      local_40.__lhs =
           (_Move_ctor_base<false,_QHttpHeaders::WellKnownHeader,_QByteArray> *)(pHVar8 + -1);
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_idx_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:667:4)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
        ::_S_vtable._M_arr[(long)*(char *)(lVar1 + -0x20) + 1]._M_data)
                ((anon_class_8_1_8991fb9c *)&local_40,
                 (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)(lVar1 + -0x38));
      pDVar2 = pHVar8[-1].value.d.d;
      pHVar8[-1].value.d.d = *(Data **)(lVar1 + -0x18);
      *(Data **)(lVar1 + -0x18) = pDVar2;
      pcVar3 = pHVar8[-1].value.d.ptr;
      pHVar8[-1].value.d.ptr = *(char **)(lVar1 + -0x10);
      *(char **)(lVar1 + -0x10) = pcVar3;
      qVar4 = pHVar8[-1].value.d.size;
      pHVar8[-1].value.d.size = *(qsizetype *)(lVar1 + -8);
      *(qsizetype *)(lVar1 + -8) = qVar4;
      *(long *)&((d_first.current)->name).data.
                super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> =
           *(long *)&((d_first.current)->name).data.
                     super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + -0x38;
      *(long *)&((first.current)->name).data.
                super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> =
           *(long *)&((first.current)->name).data.
                     super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + -0x38;
      pHVar8 = *(Header **)
                &((d_first.current)->name).data.
                 super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                 super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                 super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                 super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                 super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>;
    } while (pHVar8 != pHVar7);
  }
  local_58.iter = &local_58.end;
  if (*(Header **)
       &((first.current)->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
        super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
        super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
        super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
        super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> != pHVar6) {
    q_relocate_overlap_n_left_move<std::reverse_iterator<Header*>,long_long>();
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<Header_*>,_long_long>::Destructor::
  ~Destructor(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}